

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# game.cpp
# Opt level: O3

bool __thiscall Tetris::same(Tetris *this,Tetris *x)

{
  int *piVar1;
  int (*paiVar2) [8];
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  long lVar8;
  ulong uVar9;
  int iVar10;
  ulong uVar11;
  bool bVar12;
  pair<int,_int> hash [4];
  
  if (this->blockType != x->blockType) {
    return false;
  }
  hash[2].first = 0;
  hash[2].second = 0;
  hash[3].first = 0;
  hash[3].second = 0;
  hash[0].first = 0;
  hash[0].second = 0;
  hash[1].first = 0;
  hash[1].second = 0;
  iVar10 = this->orientation;
  iVar3 = this->blockX;
  iVar4 = this->blockY;
  paiVar2 = this->shape;
  lVar8 = 0;
  do {
    piVar1 = paiVar2[iVar10] + lVar8 * 2;
    iVar5 = piVar1[1];
    iVar6 = piVar1[2];
    iVar7 = piVar1[3];
    hash[lVar8].first = *piVar1 + iVar3;
    hash[lVar8].second = iVar5 + iVar4;
    hash[lVar8 + 1].first = iVar6 + iVar3;
    hash[lVar8 + 1].second = iVar7 + iVar4;
    lVar8 = lVar8 + 2;
  } while (lVar8 != 4);
  uVar9 = 0;
  bVar12 = false;
LAB_001188f9:
  iVar10 = x->shape[x->orientation][uVar9 * 2 + 1] + x->blockY;
  uVar11 = 0;
  do {
    if (hash[uVar11].first == x->shape[x->orientation][uVar9 * 2] + x->blockX) {
      if ((2 < uVar11) || (hash[uVar11].second == iVar10)) break;
    }
    else if (2 < uVar11) {
      return bVar12;
    }
    uVar11 = uVar11 + 1;
  } while( true );
  if (hash[uVar11].second != iVar10) {
    return bVar12;
  }
  bVar12 = 2 < uVar9;
  uVar9 = uVar9 + 1;
  if (uVar9 == 4) {
    return bVar12;
  }
  goto LAB_001188f9;
}

Assistant:

bool Tetris::same(const Tetris &x)
{
    if (blockType != x.blockType)
        return false;
    pair<int, int> hash[4];
    int i, tmpX, tmpY;
    for (i = 0; i < 4; i++) {
        tmpX = blockX + shape[orientation][2 * i];
        tmpY = blockY + shape[orientation][2 * i + 1];
        hash[i].first = tmpX, hash[i].second = tmpY;
    }
    for (i = 0; i < 4; i++) {
        tmpX = x.blockX + x.shape[x.orientation][2 * i];
        tmpY = x.blockY + x.shape[x.orientation][2 * i + 1];
        bool ok = false;
        for (int j = 0; j < 4 && !ok; ++j)
            if (hash[j].first == tmpX && hash[j].second == tmpY)
                ok = true;
        if (!ok)
            return false;
    }
    return true;
}